

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_3_1::Matrix44<float>::gjInverse(Matrix44<float> *this)

{
  Matrix44<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar1;
  float f_1;
  float f;
  float tmp_1;
  float tmp;
  float pivotsize;
  int pivot;
  Matrix44<float> t;
  Matrix44<float> s;
  int k;
  int j;
  int i;
  float local_a8;
  float local_a4;
  int local_a0;
  Matrix44<float> local_9c;
  Matrix44<float> local_5c;
  int local_1c;
  int local_18;
  int local_14;
  
  Matrix44(&local_5c);
  Matrix44(&local_9c,in_RSI);
  local_14 = 0;
  while( true ) {
    if (2 < local_14) {
      local_14 = 3;
      while( true ) {
        if (local_14 < 0) {
          Matrix44(in_RDI,&local_5c);
          return in_RDI;
        }
        fVar1 = local_9c.x[local_14][local_14];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
        for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
          local_9c.x[local_14][local_18] = local_9c.x[local_14][local_18] / fVar1;
          local_5c.x[local_14][local_18] = local_5c.x[local_14][local_18] / fVar1;
        }
        for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
          fVar1 = local_9c.x[local_18][local_14];
          for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
            local_9c.x[local_18][local_1c] =
                 -fVar1 * local_9c.x[local_14][local_1c] + local_9c.x[local_18][local_1c];
            local_5c.x[local_18][local_1c] =
                 -fVar1 * local_5c.x[local_14][local_1c] + local_5c.x[local_18][local_1c];
          }
        }
        local_14 = local_14 + -1;
      }
      Matrix44(in_RDI);
      return in_RDI;
    }
    local_a0 = local_14;
    local_a4 = local_9c.x[local_14][local_14];
    if (local_a4 < 0.0) {
      local_a4 = -local_a4;
    }
    for (local_18 = local_14 + 1; local_18 < 4; local_18 = local_18 + 1) {
      local_a8 = local_9c.x[local_18][local_14];
      if (local_a8 < 0.0) {
        local_a8 = -local_a8;
      }
      if (local_a4 < local_a8) {
        local_a0 = local_18;
        local_a4 = local_a8;
      }
    }
    if ((local_a4 == 0.0) && (!NAN(local_a4))) break;
    if (local_a0 != local_14) {
      for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
        fVar1 = local_9c.x[local_14][local_18];
        local_9c.x[local_14][local_18] = local_9c.x[local_a0][local_18];
        local_9c.x[local_a0][local_18] = fVar1;
        fVar1 = local_5c.x[local_14][local_18];
        local_5c.x[local_14][local_18] = local_5c.x[local_a0][local_18];
        local_5c.x[local_a0][local_18] = fVar1;
      }
    }
    for (local_18 = local_14 + 1; local_18 < 4; local_18 = local_18 + 1) {
      fVar1 = local_9c.x[local_18][local_14] / local_9c.x[local_14][local_14];
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        local_9c.x[local_18][local_1c] =
             -fVar1 * local_9c.x[local_14][local_1c] + local_9c.x[local_18][local_1c];
        local_5c.x[local_18][local_1c] =
             -fVar1 * local_5c.x[local_14][local_1c] + local_5c.x[local_18][local_1c];
      }
    }
    local_14 = local_14 + 1;
  }
  Matrix44(in_RDI);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline Matrix44<T>
Matrix44<T>::gjInverse() const IMATH_NOEXCEPT
{
    int i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            return Matrix44();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0)
        {
            return Matrix44();
        }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}